

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

void __thiscall duckdb::Deserializer::~Deserializer(Deserializer *this)

{
  this->_vptr_Deserializer = (_func_int **)&PTR__Deserializer_0010ec90;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->data).customs._M_h);
  std::
  _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
                  *)&(this->data).compression_infos);
  std::
  _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                  *)&(this->data).types);
  std::
  _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
                  *)&(this->data).parameter_data);
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&(this->data).enums);
  std::
  _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
                  *)&(this->data).catalogs);
  std::
  _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
                  *)&(this->data).databases);
  std::
  _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
                  *)&this->data);
  return;
}

Assistant:

virtual ~Deserializer() {
	}